

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O0

string * __thiscall
spvtools::utils::MakeString<unsigned_int_const*>
          (string *__return_storage_ptr__,utils *this,uint *first,uint *last,
          bool assert_found_terminating_null)

{
  uint uVar1;
  char cVar2;
  char c;
  ulong uStack_48;
  uint32_t extracted_word;
  size_t byte_index;
  utils *puStack_38;
  uint32_t word;
  uint *pos;
  size_t kCharsPerWord;
  bool assert_found_terminating_null_local;
  uint *last_local;
  uint *first_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (puStack_38 = this; puStack_38 != (utils *)first; puStack_38 = puStack_38 + 4) {
    uVar1 = *(uint *)puStack_38;
    for (uStack_48 = 0; uStack_48 < 4; uStack_48 = uStack_48 + 1) {
      cVar2 = (char)(uVar1 >> ((byte)(uStack_48 << 3) & 0x1f));
      if (cVar2 == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
    }
  }
  if (((ulong)last & 1) == 0) {
    return __return_storage_ptr__;
  }
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
               );
}

Assistant:

inline std::string MakeString(InputIt first, InputIt last,
                              bool assert_found_terminating_null = true) {
  std::string result;
  constexpr size_t kCharsPerWord = sizeof(*first);
  static_assert(kCharsPerWord == 4, "expect 4-byte word");

  for (InputIt pos = first; pos != last; ++pos) {
    uint32_t word = *pos;
    for (size_t byte_index = 0; byte_index < kCharsPerWord; byte_index++) {
      uint32_t extracted_word = (word >> (8 * byte_index)) & 0xFF;
      char c = static_cast<char>(extracted_word);
      if (c == 0) {
        return result;
      }
      result += c;
    }
  }
  assert(!assert_found_terminating_null &&
         "Did not find terminating null for the string.");
  (void)assert_found_terminating_null; /* No unused parameters in release
                                          builds. */
  return result;
}